

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_a9171::checkEnumValue(anon_unknown_dwarf_a9171 *this,QStringView name)

{
  ushort uVar1;
  int iVar2;
  QChar *pQVar3;
  ushort *puVar4;
  bool bVar5;
  
  puVar4 = (ushort *)name.m_size;
  if (this != (anon_unknown_dwarf_a9171 *)0x0) {
    uVar1 = *puVar4;
    iVar2 = QChar::category((uint)uVar1);
    if (((iVar2 - 0xeU < 5) || (iVar2 == 4)) || (uVar1 == 0x5f)) {
      pQVar3 = std::__find_if<QChar_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(QChar)>>
                         (puVar4 + 1,(QChar *)(puVar4 + (long)this),isEnumIdContinuation);
      bVar5 = pQVar3 == (QChar *)(puVar4 + (long)this);
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  return false;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }